

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sshpubk.c
# Opt level: O0

char ** ssh2_all_fingerprints(ssh_key *data)

{
  strbuf *sb;
  char **ppcVar1;
  ptrlen blob_00;
  char **ret;
  strbuf *blob;
  ssh_key *data_local;
  
  sb = strbuf_new();
  ssh_key_public_blob(data,sb->binarysink_);
  blob_00 = ptrlen_from_strbuf(sb);
  ppcVar1 = ssh2_all_fingerprints_for_blob(blob_00);
  strbuf_free(sb);
  return ppcVar1;
}

Assistant:

char **ssh2_all_fingerprints(ssh_key *data)
{
    strbuf *blob = strbuf_new();
    ssh_key_public_blob(data, BinarySink_UPCAST(blob));
    char **ret = ssh2_all_fingerprints_for_blob(ptrlen_from_strbuf(blob));
    strbuf_free(blob);
    return ret;
}